

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

void al_replace_path_component(ALLEGRO_PATH *path,int i,char *s)

{
  ALLEGRO_USTR *us1;
  
  if (i < 0) {
    i = i + (int)(path->segments)._size;
  }
  us1 = get_segment(path,i);
  al_ustr_assign_cstr(us1,s);
  return;
}

Assistant:

void al_replace_path_component(ALLEGRO_PATH *path, int i, const char *s)
{
   ASSERT(path);
   ASSERT(s);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   al_ustr_assign_cstr(get_segment(path, i), s);
}